

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool __thiscall
dxil_spv::emit_sample_grad_instruction(dxil_spv *this,Op opcode,Impl *impl,CallInst *instruction)

{
  pointer ppOVar1;
  int iVar2;
  uint32_t image_ops_00;
  uint32_t count;
  pointer value;
  Id IVar3;
  bool bVar4;
  bool bVar5;
  ComponentType element_type;
  Id IVar6;
  Id IVar7;
  ValueKind VVar8;
  Value *pVVar9;
  Value *pVVar10;
  Builder *pBVar11;
  Operation *this_00;
  Operation *this_01;
  Operation *pOVar12;
  mapped_type *pmVar13;
  Type *pTVar14;
  uint cols;
  Op OVar15;
  Operation **op;
  pointer ppOVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  Impl *this_02;
  int iVar18;
  Op op_00;
  ulong uVar19;
  ulong uVar20;
  uint32_t image_ops;
  uint num_coords;
  ComponentType tmp;
  uint num_coords_full;
  Value *mult_grad_x [3];
  Id grad_y [3];
  Id grad_x [3];
  Value *mult_grad_y [3];
  Id loaded_id;
  Id image_id;
  Id coord [4];
  Id offsets [3];
  undefined1 in_stack_fffffffffffffed8;
  uint32_t local_11c;
  Value *local_118;
  ulong local_110;
  int local_104;
  uint32_t local_100;
  ComponentType local_f9;
  Builder *local_f8;
  ulong local_f0;
  uint32_t local_e4;
  mapped_type *local_e0;
  Value *local_d8;
  Id local_cc;
  Vector<spv::Id> local_c8;
  Id local_a8 [4];
  Id local_98 [4];
  Value local_88;
  Value *local_68;
  ValueKind local_60;
  Id local_5c;
  Id local_58 [6];
  Id local_40 [4];
  
  this_02 = (Impl *)CONCAT44(in_register_00000034,opcode);
  iVar18 = (int)this;
  if ((iVar18 != 0xfe) &&
     (bVar4 = Converter::Impl::composite_is_accessed(this_02,(Value *)impl), !bVar4)) {
    return true;
  }
  local_f8 = Converter::Impl::builder(this_02);
  pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,1);
  local_5c = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
  pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,2);
  IVar6 = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
  IVar6 = Converter::Impl::build_sampled_image(this_02,local_5c,IVar6,iVar18 == 0xfe);
  local_e0 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this_02->handle_to_resource_meta,&local_5c);
  local_e4 = 0;
  local_100 = 0;
  bVar4 = get_image_dimensions(this_02,local_5c,&local_e4,&local_100);
  if (!bVar4) {
    return bVar4;
  }
  local_11c = 4;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  uVar20 = (ulong)local_e4;
  if (uVar20 != 0) {
    uVar19 = 0;
    do {
      pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,(int)uVar19 + 3);
      IVar7 = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
      local_58[uVar19] = IVar7;
      uVar19 = uVar19 + 1;
    } while (uVar20 != uVar19);
  }
  local_40[2] = 0;
  local_40[0] = 0;
  local_40[1] = 0;
  local_110 = (ulong)local_100;
  get_texel_offsets(this_02,(CallInst *)impl,&local_11c,7,local_100,local_40,
                    (bool)in_stack_fffffffffffffed8);
  local_f0 = (ulong)(iVar18 == 0xfe | 10);
  uVar20 = 0;
  local_104 = iVar18;
  local_cc = IVar6;
  if ((this_02->current_block != (Vector<Operation_*> *)0x0) &&
     (uVar20 = 0, (this_02->options).grad_opt.enabled == true)) {
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.tween_id = 0;
    local_88.type = (Type *)0x0;
    local_88.kind = Argument;
    local_88._12_4_ = 0;
    if (local_110 != 0) {
      uVar19 = 0;
      do {
        iVar18 = (int)uVar19;
        pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar18 + 3);
        pVVar10 = LLVMBC::Internal::resolve_proxy(pVVar9);
        VVar8 = LLVMBC::Value::get_value_kind(pVVar10);
        bVar5 = LLVMBC::Constant::is_base_of_value_kind(VVar8);
        if (bVar5) goto LAB_001702c2;
        iVar2 = (int)local_f0;
        local_118 = pVVar9;
        pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar2 + iVar18);
        pVVar10 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar2 + iVar18 + 3);
        uVar20 = 0;
        local_d8 = pVVar9;
        IVar6 = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
        local_68 = pVVar10;
        IVar7 = Converter::Impl::get_id_for_value(this_02,pVVar10,0);
        pVVar9 = local_118;
        if ((IVar6 == 0) || (IVar7 == 0)) goto LAB_001702cc;
        ppOVar16 = (this_02->current_block->
                   super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppOVar1 = (this_02->current_block->
                  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (ppOVar16 == ppOVar1) goto LAB_001702cc;
        do {
          IVar3 = 0;
          if ((*ppOVar16)->id != IVar6) {
            IVar3 = IVar6;
          }
          IVar6 = IVar3;
          IVar3 = 0;
          if ((*ppOVar16)->id != IVar7) {
            IVar3 = IVar7;
          }
          IVar7 = IVar3;
          ppOVar16 = ppOVar16 + 1;
        } while (ppOVar16 != ppOVar1);
        uVar20 = 0;
        if (((IVar6 != 0 || IVar7 != 0) ||
            (bVar5 = binary_op_is_multiple_of_derivative
                               (local_d8,local_118,DerivCoarseX,DerivFineX,
                                (Value **)
                                (&local_c8.
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar19)), !bVar5)) ||
           (bVar5 = binary_op_is_multiple_of_derivative
                              (local_68,pVVar9,DerivCoarseY,DerivFineY,
                               (Value **)(&local_88.type + uVar19)), !bVar5)) goto LAB_001702cc;
        uVar19 = uVar19 + 1;
      } while (uVar19 != local_110);
      uVar20 = 0;
      do {
        pVVar9 = (Value *)(&local_c8.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start)[uVar20];
        if (((pVVar9 == (Value *)0x0) || ((Value *)(&local_88.type)[uVar20] == (Value *)0x0)) ||
           ((uVar20 != 0 &&
            ((pVVar9 != (Value *)local_c8.
                                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_start ||
             ((Value *)(&local_88.type)[uVar20] != (Value *)local_88.type)))))) goto LAB_001702c2;
        uVar20 = uVar20 + 1;
      } while (local_110 != uVar20);
    }
    pTVar14 = local_88.type;
    value = local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (((Type *)local_c8.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start == local_88.type) ||
       (uVar20 = 0, (this_02->options).grad_opt.assume_uniform_scale == true)) {
      pBVar11 = Converter::Impl::builder(this_02);
      if (this_02->glsl_std450_ext == 0) {
        IVar6 = spv::Builder::import(pBVar11,"GLSL.std.450");
        this_02->glsl_std450_ext = IVar6;
      }
      IVar6 = spv::Builder::makeFloatType(pBVar11,0x20);
      this_00 = Converter::Impl::allocate(this_02,OpExtInst,IVar6);
      Operation::add_id(this_00,this_02->glsl_std450_ext);
      Operation::add_literal(this_00,4);
      IVar7 = Converter::Impl::get_id_for_value(this_02,(Value *)value,0);
      Operation::add_id(this_00,IVar7);
      Converter::Impl::add(this_02,this_00,false);
      pOVar12 = this_00;
      if ((Type *)value != pTVar14) {
        this_01 = Converter::Impl::allocate(this_02,OpExtInst,IVar6);
        local_118 = (Value *)CONCAT44(local_118._4_4_,IVar6);
        Operation::add_id(this_01,this_02->glsl_std450_ext);
        Operation::add_literal(this_01,4);
        IVar6 = Converter::Impl::get_id_for_value(this_02,(Value *)pTVar14,0);
        Operation::add_id(this_01,IVar6);
        Converter::Impl::add(this_02,this_01,false);
        pOVar12 = Converter::Impl::allocate(this_02,OpExtInst,(Id)local_118);
        Operation::add_id(pOVar12,this_02->glsl_std450_ext);
        Operation::add_literal(pOVar12,0x25);
        Operation::add_id(pOVar12,this_00->id);
        IVar6 = (Id)local_118;
        Operation::add_id(pOVar12,this_01->id);
        Converter::Impl::add(this_02,pOVar12,false);
      }
      IVar7 = pOVar12->id;
      pOVar12 = Converter::Impl::allocate(this_02,OpExtInst,IVar6);
      Operation::add_id(pOVar12,this_02->glsl_std450_ext);
      Operation::add_literal(pOVar12,0x1e);
      Operation::add_id(pOVar12,IVar7);
      Converter::Impl::add(this_02,pOVar12,false);
      uVar20 = (ulong)pOVar12->id;
    }
  }
LAB_001702cc:
  iVar18 = local_104;
  uVar19 = local_110;
  local_98[2] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_a8[2] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_118 = (Value *)uVar20;
  if ((int)uVar20 == 0) {
    if (local_110 != 0) {
      iVar2 = (Id)local_f0;
      uVar20 = 0;
      do {
        pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar2 + (int)uVar20);
        IVar6 = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
        local_98[uVar20] = IVar6;
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar20);
      uVar20 = 0;
      do {
        pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,iVar2 + 3 + (int)uVar20);
        IVar6 = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
        local_a8[uVar20] = IVar6;
        uVar20 = uVar20 + 1;
      } while (uVar19 != uVar20);
    }
  }
  else {
    local_11c = 1;
  }
  uVar17 = iVar18 == 0xfe | 0x10;
  pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,uVar17);
  pVVar9 = LLVMBC::Internal::resolve_proxy(pVVar9);
  VVar8 = LLVMBC::Value::get_value_kind(pVVar9);
  local_f0 = local_f0 & 0xffffffff00000000;
  if (VVar8 != Undef) {
    pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,uVar17);
    IVar6 = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
    local_11c = local_11c | 0x80;
    local_f0 = CONCAT44(local_f0._4_4_,IVar6);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_c8.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2a);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_f8->capabilities,(Capability *)&local_c8);
  }
  local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)impl;
  pmVar13 = std::__detail::
            _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this_02->llvm_composite_meta,(key_type *)&local_c8);
  uVar17 = pmVar13->access_mask;
  if ((uVar17 & 0x10) != 0) {
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_c8.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x29);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_f8->capabilities,(Capability *)&local_c8);
  }
  element_type = Converter::Impl::get_effective_typed_resource_type(local_e0->component_type);
  cols = (uint)(iVar18 != 0xfe) * 3 + 1;
  local_d8 = (Value *)CONCAT44(local_d8._4_4_,cols);
  IVar6 = Converter::Impl::get_type_id(this_02,element_type,1,cols,false);
  local_110 = CONCAT44(local_110._4_4_,uVar17);
  if ((uVar17 & 0x10) != 0) {
    IVar7 = spv::Builder::makeIntegerType(local_f8,0x20,false);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)&((Impl *)local_c8.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitcode_reflection_parser;
    *(Id *)&((Impl *)local_c8.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start)->bitcode_parser = IVar7;
    *(Id *)((long)&((Impl *)local_c8.
                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitcode_parser + 4) = IVar6;
    local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    IVar6 = Converter::Impl::get_struct_type(this_02,&local_c8,0,"SparseTexel");
    if ((Impl *)local_c8.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (Impl *)0x0) {
      free_in_thread(local_c8.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar17 = (uint)local_110;
  }
  if (iVar18 == 0xfe) {
    bVar5 = (uVar17 & 0x10) == 0;
    OVar15 = OpImageSparseSampleDrefImplicitLod;
    if (bVar5) {
      OVar15 = OpImageSampleDrefImplicitLod;
    }
    op_00 = OpImageSparseSampleDrefExplicitLod;
    if (bVar5) {
      op_00 = OpImageSampleDrefExplicitLod;
    }
    if ((int)local_118 != 0) {
      op_00 = OVar15;
    }
    pVVar9 = LLVMBC::Instruction::getOperand((Instruction *)impl,10);
    IVar7 = Converter::Impl::get_id_for_value(this_02,pVVar9,0);
  }
  else {
    if ((int)local_118 == 0) {
      OVar15 = OpImageSampleExplicitLod;
      op_00 = OpImageSparseSampleExplicitLod;
    }
    else {
      OVar15 = OpImageSampleImplicitLod;
      op_00 = OpImageSparseSampleImplicitLod;
    }
    if ((uVar17 & 0x10) == 0) {
      op_00 = OVar15;
    }
    IVar7 = 0;
  }
  pOVar12 = Converter::Impl::allocate(this_02,op_00,(Value *)impl,IVar6);
  if ((uVar17 & 0x10) == 0) {
    pTVar14 = LLVMBC::Value::getType((Value *)impl);
    pTVar14 = LLVMBC::Type::getStructElementType(pTVar14,0);
    Converter::Impl::decorate_relaxed_precision(this_02,pTVar14,pOVar12->id,true);
  }
  Operation::add_id(pOVar12,local_cc);
  IVar6 = spv::Builder::makeFloatType(local_f8,0x20);
  IVar6 = Converter::Impl::build_vector(this_02,IVar6,local_58,local_e4);
  Operation::add_id(pOVar12,IVar6);
  iVar18 = local_104;
  if (IVar7 != 0) {
    Operation::add_id(pOVar12,IVar7);
  }
  image_ops_00 = local_11c;
  Operation::add_literal(pOVar12,local_11c);
  pBVar11 = local_f8;
  if ((image_ops_00 & 4) == 0) {
    IVar6 = (Id)local_118;
    if ((image_ops_00 & 1) == 0) goto LAB_0017066f;
  }
  else {
    IVar6 = spv::Builder::makeFloatType(local_f8,0x20);
    count = local_100;
    IVar6 = Converter::Impl::build_vector(this_02,IVar6,local_98,local_100);
    Operation::add_id(pOVar12,IVar6);
    iVar18 = local_104;
    IVar6 = spv::Builder::makeFloatType(pBVar11,0x20);
    IVar6 = Converter::Impl::build_vector(this_02,IVar6,local_a8,count);
  }
  Operation::add_id(pOVar12,IVar6);
LAB_0017066f:
  if ((image_ops_00 & 0x18) != 0) {
    IVar6 = build_texel_offset_vector(this_02,local_40,local_100,image_ops_00,false);
    Operation::add_id(pOVar12,IVar6);
  }
  if ((char)image_ops_00 < '\0') {
    Operation::add_id(pOVar12,(Id)local_f0);
  }
  Converter::Impl::add(this_02,pOVar12,false);
  pTVar14 = LLVMBC::Value::getType((Value *)impl);
  pTVar14 = LLVMBC::Type::getStructElementType(pTVar14,0);
  if ((local_110 & 0x10) == 0) {
    if (iVar18 == 0xfe) {
      local_60 = pOVar12->id;
      local_f9 = local_e0->component_type;
      Converter::Impl::fixup_load_type_typed(this_02,&local_f9,1,&local_60,pTVar14);
      IVar6 = Converter::Impl::get_type_id(this_02,pTVar14,0);
      IVar6 = spv::Builder::makeVectorType(local_f8,IVar6,4);
      pOVar12 = Converter::Impl::allocate(this_02,OpCompositeConstruct,IVar6);
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_88;
      local_88.type = (Type *)CONCAT44(local_60,local_60);
      local_88._12_4_ = local_60;
      local_88.kind = local_60;
      local_c8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
      Operation::add_ids(pOVar12,(initializer_list<unsigned_int> *)&local_c8);
      Converter::Impl::add(this_02,pOVar12,false);
      Converter::Impl::rewrite_value(this_02,(Value *)impl,pOVar12->id);
    }
    else {
      Converter::Impl::fixup_load_type_typed
                (this_02,local_e0->component_type,4,(Value *)impl,pTVar14);
      build_exploded_composite_from_vector(this_02,(Instruction *)impl,4);
    }
  }
  else {
    Converter::Impl::repack_sparse_feedback
              (this_02,local_e0->component_type,(uint)local_d8,(Value *)impl,pTVar14,0);
  }
  return bVar4;
LAB_001702c2:
  uVar20 = 0;
  goto LAB_001702cc;
}

Assistant:

bool emit_sample_grad_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmpGrad;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	uint32_t image_ops = spv::ImageOperandsGradMask;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	unsigned grad_argument_index = comparison_sampling ? 11 : 10;
	spv::Id bias_id = sample_grad_is_lod_bias(impl, instruction, num_coords, grad_argument_index);

	spv::Id grad_x[3] = {};
	spv::Id grad_y[3] = {};

	if (bias_id)
	{
		image_ops = spv::ImageOperandsBiasMask;
	}
	else
	{
		for (unsigned i = 0; i < num_coords; i++)
			grad_x[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index));
		for (unsigned i = 0; i < num_coords; i++)
			grad_y[i] = impl.get_id_for_value(instruction->getOperand(i + grad_argument_index + 3));
	}

	unsigned min_lod_argument_index = comparison_sampling ? 17 : 16;
	spv::Id aux_argument = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
	{
		aux_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
		image_ops |= spv::ImageOperandsMinLodMask;
		builder.addCapability(spv::CapabilityMinLod);
	}

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Id dref_id = 0;
	spv::Op spv_op;
	if (comparison_sampling)
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;

		dref_id = impl.get_id_for_value(instruction->getOperand(10));
	}
	else
	{
		if (bias_id)
			spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		else
			spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
	}

	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_x, num_coords));
		op->add_id(impl.build_vector(builder.makeFloatType(32), grad_y, num_coords));
	}
	else if (image_ops & spv::ImageOperandsBiasMask)
		op->add_id(bias_id);

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
		op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(aux_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}